

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolve.cpp
# Opt level: O2

Matrix * __thiscall TriangularSolve::solve(TriangularSolve *this,Matrix *L,Matrix *d,int dia)

{
  int row;
  Matrix *this_00;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int j;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  allocator local_51;
  string local_50;
  
  this_00 = (Matrix *)operator_new(0x30);
  row = this->rowNo;
  std::__cxx11::string::string((string *)&local_50,"y(Unknowns):",&local_51);
  Matrix::Matrix(this_00,row,1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  uVar1 = (long)dia / 2 & 0xffffffff;
  lVar3 = (long)(int)((long)dia / 2);
  uVar4 = 0;
  uVar2 = (ulong)(uint)this->rowNo;
  if (this->rowNo < 1) {
    uVar2 = uVar4;
  }
  lVar5 = -8;
  do {
    if (uVar4 == uVar2) {
      return this_00;
    }
    dVar9 = 0.0;
    lVar7 = lVar5;
    uVar8 = uVar1;
    if (lVar3 < (long)uVar4) {
LAB_00154ff3:
      for (; 0 < (int)uVar8; uVar8 = uVar8 - 1) {
        dVar9 = dVar9 + L->array[uVar4][uVar8 - 1] * **(double **)((long)this_00->array + lVar7);
        lVar7 = lVar7 + -8;
      }
      *this_00->array[uVar4] = (*d->array[uVar4] - dVar9) / L->array[uVar4][lVar3];
    }
    else {
      for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
        dVar9 = dVar9 + L->array[uVar4][uVar6] * *this_00->array[uVar6];
      }
      *this_00->array[uVar4] = (*d->array[uVar4] - dVar9) / L->array[uVar4][uVar4];
      if (lVar3 < (long)uVar4) goto LAB_00154ff3;
    }
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 8;
  } while( true );
}

Assistant:

Matrix* TriangularSolve::solve(Matrix *L, Matrix *d, int dia)
{
    Matrix *y = new Matrix(rowNo, 1, "y(Unknowns):");
    double s = 0;
    int c=0;
    int d1 = dia/2;

    for(int i=0; i<rowNo; i++)
    {
        if(i<=d1)
        {
            for(int j=0; j<i ; j++)
            {
               s += L->array[i][j]*y->array[j][0];
            }
          y->array[i][0] = (d->array[i][0] - s) / L->array[i][i];

        }
         if(i>d1)
        {
            for (int j = i-1; j > j-d1; j--)
            {
                d1--;
                s += L->array[i][d1]*y->array[j][0];
            }
          d1=dia/2;
          y->array[i][0] = (d->array[i][0] - s) / L->array[i][d1];
        }

        s = 0;
    }
    return y;
}